

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ParameterError PVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  CURLSH *share;
  char *__s1;
  OperationConfig *config;
  size_t i;
  
  if (argc < 2) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = argv[1];
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (argc == 1) {
LAB_0011539a:
    parseconfig((char *)0x0,global);
    bVar1 = true;
    CVar4 = CURLE_OK;
    if ((argc < 2) && (CVar4 = CURLE_OK, global->first->url_list == (getout *)0x0)) {
      bVar1 = false;
      helpf(tool_stderr,(char *)0x0);
      CVar4 = CURLE_FAILED_INIT;
    }
  }
  else {
    CVar4 = CURLE_OK;
    bVar1 = true;
    if (((__s1 != (char *)0x0) && (iVar2 = strncmp(__s1,"-q",2), iVar2 != 0)) &&
       (iVar2 = strcmp(__s1,"--disable"), iVar2 != 0)) goto LAB_0011539a;
  }
  if (bVar1) {
    PVar3 = parse_args(global,argc,argv);
    CVar5 = CURLE_OK;
    CVar4 = CURLE_OK;
    switch(PVar3) {
    case PARAM_HELP_REQUESTED:
      tool_help(global->help_category);
      CVar4 = CVar5;
      break;
    case PARAM_MANUAL_REQUESTED:
      hugehelp();
      CVar4 = CVar5;
      break;
    case PARAM_VERSION_INFO_REQUESTED:
      tool_version_info();
      CVar4 = CVar5;
      break;
    case PARAM_ENGINES_REQUESTED:
      tool_list_engines();
      CVar4 = CVar5;
      break;
    case PARAM_CA_EMBED_REQUESTED:
      break;
    case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
      CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    case PARAM_READ_ERROR:
      CVar4 = CURLE_READ_ERROR;
      break;
    default:
      if (PVar3 == PARAM_OK) {
        if (global->libcurl == (char *)0x0) {
          CVar4 = CURLE_OK;
        }
        else {
          CVar4 = easysrc_init();
        }
        if (CVar4 == CURLE_OK) {
          config = global->first;
          share = (CURLSH *)curl_share_init();
          CVar4 = CURLE_OK;
          if ((share == (CURLSH *)0x0) &&
             (CVar4 = CURLE_OUT_OF_MEMORY, global->libcurl != (char *)0x0)) {
            easysrc_cleanup();
          }
          if (share != (CURLSH *)0x0) {
            CVar4 = CURLE_OK;
            curl_share_setopt(share,1,2);
            curl_share_setopt(share,1,3);
            curl_share_setopt(share,1,4);
            if ((global->field_0x63 & 1) == 0) {
              curl_share_setopt(share,1,5);
            }
            curl_share_setopt(share,1,6);
            curl_share_setopt(share,1,7);
            if ((global->ssl_sessions != (char *)0x0) && (feature_ssls_export == true)) {
              CVar4 = tool_ssls_load(global,global->first,share,global->ssl_sessions);
            }
            if (CVar4 == CURLE_OK) {
              i = 0;
              do {
                CVar4 = get_args(config,i);
                if (CVar4 != CURLE_OK) break;
                i = i + 1;
                config = config->next;
              } while (config != (OperationConfig *)0x0);
              global->current = global->first;
              CVar5 = run_all_transfers(global,share,CVar4);
              CVar4 = CVar5;
              if ((global->ssl_sessions != (char *)0x0) && (feature_ssls_export == true)) {
                CVar6 = tool_ssls_save(global,global->first,share,global->ssl_sessions);
                CVar4 = CVar6;
                if (CVar5 != CURLE_OK) {
                  CVar4 = CVar5;
                }
                if (CVar6 == CURLE_OK) {
                  CVar4 = CVar5;
                }
              }
            }
            curl_share_cleanup(share);
            if (global->libcurl != (char *)0x0) {
              easysrc_cleanup();
              dumpeasysrc(global);
            }
          }
        }
        else {
          errorf(global,"out of memory");
        }
        break;
      }
    case PARAM_GOT_EXTRA_PARAMETER:
    case PARAM_BAD_NUMERIC:
    case PARAM_NEGATIVE_NUMERIC:
    case PARAM_LIBCURL_DOESNT_SUPPORT:
    case PARAM_NO_MEM:
    case PARAM_NEXT_OPERATION:
    case PARAM_NO_PREFIX:
    case PARAM_NUMBER_TOO_LARGE:
    case PARAM_NO_NOT_BOOLEAN:
    case PARAM_CONTDISP_RESUME_FROM:
      CVar4 = CURLE_FAILED_INIT;
    }
  }
  varcleanup(global);
  curl_free(global->knownhosts);
  return CVar4;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  const char *first_arg;
#ifdef UNDER_CE
  first_arg = argc > 1 ? strdup(argv[1]) : NULL;
#else
  first_arg = argc > 1 ? convert_tchar_to_UTF8(argv[1]) : NULL;
#endif

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED) {
#ifdef USE_MANUAL
        hugehelp();
#else
        puts("built-in manual was disabled at build-time");
#endif
      }
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          /* Running parallel, use the multi connection cache */
          if(!global->parallel)
            curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          if(global->ssl_sessions && feature_ssls_export)
            result = tool_ssls_load(global, global->first, share,
                                    global->ssl_sessions);

          if(!result) {
            /* Get the required arguments for each operation */
            do {
              result = get_args(operation, count++);

              operation = operation->next;
            } while(!result && operation);

            /* Set the current operation pointer */
            global->current = global->first;

            /* now run! */
            result = run_all_transfers(global, share, result);

            if(global->ssl_sessions && feature_ssls_export) {
              CURLcode r2 = tool_ssls_save(global, global->first, share,
                                           global->ssl_sessions);
              if(r2 && !result)
                result = r2;
            }
          }

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);
  curl_free(global->knownhosts);

  return result;
}